

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O1

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,Register8Bits dest,ExtendedRegisters srcMemReg,int offset)

{
  pointer *ppuVar1;
  iterator iVar2;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  uchar *__args;
  ExtendedRegisters EVar3;
  size_t i;
  long lVar4;
  IntToBytes converter;
  undefined8 local_28;
  
  local_28._4_4_ = (undefined4)((uint7)in_register_00000001 >> 0x18);
  local_28._0_3_ = (undefined3)CONCAT71(in_register_00000001,in_AL);
  local_28._0_4_ = CONCAT13(0x41,(undefined3)local_28);
  iVar2._M_current =
       (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar2,(uchar *)((long)&local_28 + 3));
  }
  else {
    *iVar2._M_current = 'A';
    ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  local_28._0_3_ = CONCAT12(0x8a,(undefined2)local_28);
  iVar2._M_current =
       (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar2,(uchar *)((long)&local_28 + 2));
  }
  else {
    *iVar2._M_current = 0x8a;
    ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  EVar3 = dest << 3 | srcMemReg;
  local_28 = CONCAT62(local_28._2_6_,CONCAT11(EVar3,(undefined1)local_28)) | 0x8000;
  iVar2._M_current =
       (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar2,(uchar *)((long)&local_28 + 1));
  }
  else {
    *iVar2._M_current = EVar3 | 0x80;
    ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  local_28 = CONCAT44(offset,(undefined4)local_28);
  lVar4 = 0;
  do {
    __args = (uchar *)((long)&local_28 + lVar4 + 4);
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)codeGen,iVar2,__args);
    }
    else {
      *iVar2._M_current = *__args;
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, Register8Bits dest, ExtendedRegisters srcMemReg, int offset) {
		codeGen.push_back(0x41);
		codeGen.push_back(0x8a);
		codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}